

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  clock_t cVar3;
  clock_t cVar4;
  DebugFilters *pDVar5;
  double dVar6;
  allocator local_21c;
  allocator local_21b;
  allocator local_21a;
  allocator local_219;
  string report;
  string file;
  MemoryMappedFile exeFile;
  DebugFilters local_1b0;
  string local_178;
  string local_158;
  DebugInfo info;
  
  local_1b0.name._M_dataplus._M_p = (pointer)&local_1b0.name.field_2;
  local_1b0.name._M_string_length = 0;
  local_1b0.name.field_2._M_local_buf[0] = '\0';
  local_1b0.minFunction = 0x200;
  local_1b0.minData = 0x400;
  local_1b0.minClass = 0x800;
  local_1b0.minFile = 0x800;
  local_1b0.minTemplate = 0x200;
  local_1b0.minTemplateCount = 3;
  file._M_dataplus._M_p = (pointer)&file.field_2;
  file._M_string_length = 0;
  file.field_2._M_local_buf[0] = '\0';
  parg_init((parg_state *)&report);
  do {
    iVar2 = parg_getopt_long((parg_state *)&report,argc,argv,"an:m:f:d:c:F:t:T:h",
                             (parg_option *)
                             parse_cmdline(int,char_const**,DebugFilters&,std::__cxx11::string&)::
                             argsTable,(int *)0x0);
    switch(iVar2) {
    case 0x61:
      local_1b0.minFunction = 0;
      local_1b0.minData = 0;
      local_1b0.minClass = 0;
      local_1b0.minFile = 0;
      local_1b0.minTemplate = 0;
      break;
    case 0x62:
    case 0x65:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
switchD_00106a14_caseD_62:
      info.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&info.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      info.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      info.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)info.m_Symbols.
                            super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      info.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x40000000200;
      info.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x80000000800;
      info.m_Namespaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x300000200;
      fwrite("Usage: Sizer [options] exe_or_pdb_file\n",0x27,1,_stderr);
      fwrite(" -n str  or --name=str           Only include things containing \'str\' into report\n"
             ,0x52,1,_stderr);
      fwrite(" -a size or --all                Include all symbols, same as --min=0\n",0x46,1,
             _stderr);
      fwrite(" -m size or --min=size           Minimum size for anything to be reported (default varies, see below)\n"
             ,0x66,1,_stderr);
      fprintf(_stderr,
              " -f size or --funcmin=size       Minimum size for functions to be reported (default %.1f)\n"
              ,(double)(int)info.m_Contribs.
                            super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
                            super__Vector_impl_data._M_finish * 0.0009765625);
      fprintf(_stderr,
              " -d size or --datamin=size       Minimum size for data to be reported (default %.1f)\n"
              ,(double)info.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish._4_4_ * 0.0009765625);
      fprintf(_stderr,
              " -c size or --classmin=size      Minimum size for class to be reported (default %.1f)\n"
              ,(double)(int)info.m_Contribs.
                            super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage * 0.0009765625);
      fprintf(_stderr,
              " -F size or --filemin=size       Minimum size for file to be reported (default %.1f)\n"
              ,(double)info.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 0.0009765625);
      fprintf(_stderr,
              " -t size or --templatemin=size   Minimum size for template to be reported (default %.1f)\n"
              ,(double)(int)info.m_Namespaces.
                            super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                            _M_impl.super__Vector_impl_data._M_start * 0.0009765625);
      iVar2 = 0;
      fprintf(_stderr,
              " -T cnt  or --templatecount=cnt  Minimum instantiation count for template to be reported (default %i)\n"
              ,(ulong)info.m_Namespaces.
                      super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                      super__Vector_impl_data._M_start >> 0x20);
      fwrite(" -h or --help                    Print this help\n",0x31,1,_stderr);
      std::__cxx11::string::~string((string *)&info);
LAB_00106cee:
      std::__cxx11::string::~string((string *)&file);
      std::__cxx11::string::~string((string *)&local_1b0);
      return iVar2;
    case 99:
      dVar6 = atof(report._M_dataplus._M_p);
      local_1b0.minClass = (int)(dVar6 * 1024.0);
      break;
    case 100:
      dVar6 = atof(report._M_dataplus._M_p);
      local_1b0.minData = (int)(dVar6 * 1024.0);
      break;
    case 0x66:
      dVar6 = atof(report._M_dataplus._M_p);
      local_1b0.minFunction = (int)(dVar6 * 1024.0);
      break;
    case 0x6d:
      dVar6 = atof(report._M_dataplus._M_p);
      local_1b0.minTemplate = (int)(dVar6 * 1024.0);
      local_1b0.minClass = local_1b0.minTemplate;
      local_1b0.minFile = local_1b0.minTemplate;
      local_1b0.minFunction = local_1b0.minTemplate;
      local_1b0.minData = local_1b0.minTemplate;
      break;
    case 0x6e:
      pDVar5 = &local_1b0;
LAB_00106a78:
      std::__cxx11::string::assign((char *)pDVar5);
      break;
    default:
      pDVar5 = (DebugFilters *)&file;
      if (iVar2 == 1) goto LAB_00106a78;
      if (iVar2 == 0x46) {
        dVar6 = atof(report._M_dataplus._M_p);
        local_1b0.minFile = (int)(dVar6 * 1024.0);
      }
      else if (iVar2 == 0x54) {
        local_1b0.minTemplateCount = atoi(report._M_dataplus._M_p);
      }
      else {
        if (iVar2 != 0x74) {
          if (iVar2 == -1) {
            if (file._M_string_length != 0) {
              info.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &info.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header;
              info.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
              ;
              info.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              info.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              info.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              info.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              info.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              info.m_Namespaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              info.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              info.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              info.m_Namespaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              info.m_Namespaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              info.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &info.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header;
              info.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_red;
              info.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              info.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              info.m_ObjectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              info.m_ObjectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              info.m_ObjectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              info.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              info.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &info.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header;
              info.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_red;
              info.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              info.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              info.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              info.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              info.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              info.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   info.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              info.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   info.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              info.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   info.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              cVar3 = clock();
              std::__cxx11::string::string((string *)&report,".exe",&local_219);
              bVar1 = ends_with(&file,&report);
              if (bVar1) {
LAB_00106e38:
                std::__cxx11::string::~string((string *)&report);
LAB_00106e42:
                fprintf(_stderr,"Finding debug location for %s ...\n",file._M_dataplus._M_p);
                MemoryMappedFile::MemoryMappedFile(&exeFile,file._M_dataplus._M_p);
                if (exeFile.baseAddress == (void *)0x0) {
                  fprintf(_stderr,"ERROR: failed to memory-map file \'%s\'\n",file._M_dataplus._M_p)
                  ;
                  iVar2 = 1;
                }
                else {
                  PEGetPDBPath_abi_cxx11_(&report,exeFile.baseAddress,exeFile.fileSize);
                  if (CONCAT44(report._M_string_length._4_4_,(undefined4)report._M_string_length) !=
                      0) {
                    std::__cxx11::string::_M_assign((string *)&file);
                  }
                  std::__cxx11::string::~string((string *)&report);
                  iVar2 = 0;
                }
                MemoryMappedFile::~MemoryMappedFile(&exeFile);
                if (exeFile.baseAddress != (void *)0x0) goto LAB_00106f36;
              }
              else {
                std::__cxx11::string::string((string *)&exeFile,".dll",&local_21a);
                bVar1 = ends_with(&file,(string *)&exeFile);
                if (bVar1) {
LAB_00106e2e:
                  std::__cxx11::string::~string((string *)&exeFile);
                  goto LAB_00106e38;
                }
                std::__cxx11::string::string((string *)&local_178,".EXE",&local_21b);
                bVar1 = ends_with(&file,&local_178);
                if (bVar1) {
                  std::__cxx11::string::~string((string *)&local_178);
                  goto LAB_00106e2e;
                }
                std::__cxx11::string::string((string *)&local_158,".DLL",&local_21c);
                bVar1 = ends_with(&file,&local_158);
                std::__cxx11::string::~string((string *)&local_158);
                std::__cxx11::string::~string((string *)&local_178);
                std::__cxx11::string::~string((string *)&exeFile);
                std::__cxx11::string::~string((string *)&report);
                if (bVar1) goto LAB_00106e42;
LAB_00106f36:
                fprintf(_stderr,"Reading debug info for %s ...\n",file._M_dataplus._M_p);
                bVar1 = ReadDebugInfo(file._M_dataplus._M_p,&info);
                if (bVar1) {
                  fwrite("\nProcessing info...\n",0x14,1,_stderr);
                  DebugInfo::ComputeDerivedData(&info);
                  fwrite("Generating report...\n",0x15,1,_stderr);
                  DebugInfo::WriteReport_abi_cxx11_(&report,&info,&local_1b0);
                  cVar4 = clock();
                  fwrite("Printing...\n",0xc,1,_stderr);
                  puts(report._M_dataplus._M_p);
                  fprintf(_stderr,"Done in %.2f seconds!\n",(double)((float)(cVar4 - cVar3) / 1e+06)
                         );
                  std::__cxx11::string::~string((string *)&report);
                  iVar2 = 0;
                }
                else {
                  iVar2 = 1;
                  fwrite("ERROR reading file via PDB\n",0x1b,1,_stderr);
                }
              }
              DebugInfo::~DebugInfo(&info);
              goto LAB_00106cee;
            }
          }
          else if (iVar2 == 0x3f) {
            fprintf(_stderr,"Unknown argument or missing value for \'%c\'\n",
                    (ulong)report._M_string_length._4_4_);
          }
          goto switchD_00106a14_caseD_62;
        }
        dVar6 = atof(report._M_dataplus._M_p);
        local_1b0.minTemplate = (int)(dVar6 * 1024.0);
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char * const * argv)
{
    DebugFilters filters;
    std::string file;
    if (!parse_cmdline(argc, argv, filters, file))
    {
        return 0;
    }

    DebugInfo info;

    clock_t time1 = clock();

    if (ends_with(file, ".exe") || ends_with(file, ".dll") || ends_with(file, ".EXE") || ends_with(file, ".DLL"))
    {
        fprintf(stderr, "Finding debug location for %s ...\n", file.c_str());
        MemoryMappedFile exeFile(file.c_str());
        if (exeFile.baseAddress == nullptr)
        {
            fprintf(stderr, "ERROR: failed to memory-map file '%s'\n", file.c_str());
            return 1;
        }
        std::string pdbPath = PEGetPDBPath(exeFile.baseAddress, exeFile.fileSize);
        if (!pdbPath.empty())
            file = pdbPath;
    }

    fprintf(stderr, "Reading debug info for %s ...\n", file.c_str());
    bool pdbok = ReadDebugInfo(file.c_str(), info);
    if (!pdbok)
    {
        fprintf(stderr, "ERROR reading file via PDB\n");
        return 1;
    }
    fprintf(stderr, "\nProcessing info...\n");
    info.ComputeDerivedData();

    fprintf(stderr, "Generating report...\n");
    std::string report = info.WriteReport(filters);

    clock_t time2 = clock();
    float secs = float(time2 - time1) / CLOCKS_PER_SEC;

    fprintf(stderr, "Printing...\n");
    puts(report.c_str());
    fprintf(stderr, "Done in %.2f seconds!\n", secs);


    return 0;
}